

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2s_ref.c
# Opt level: O1

int blake2s_init_key(blake2s_state *S,size_t outlen,void *key,size_t keylen)

{
  int iVar1;
  uint8_t block [64];
  blake2s_param local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  iVar1 = -1;
  if ((0xffffffffffffffdf < outlen - 0x21) &&
     (0xffffffffffffffdf < keylen - 0x21 && key != (void *)0x0)) {
    local_88.digest_length = (uint8_t)outlen;
    local_88.key_length = (uint8_t)keylen;
    local_88.fanout = '\x01';
    local_88.depth = '\x01';
    local_88.leaf_length = 0;
    local_88.node_offset = 0;
    local_88.xof_length = 0;
    local_88.node_depth = '\0';
    local_88.inner_length = '\0';
    local_88.salt[0] = '\0';
    local_88.salt[1] = '\0';
    local_88.salt[2] = '\0';
    local_88.salt[3] = '\0';
    local_88.salt[4] = '\0';
    local_88.salt[5] = '\0';
    local_88.salt[6] = '\0';
    local_88.salt[7] = '\0';
    local_88.personal[0] = '\0';
    local_88.personal[1] = '\0';
    local_88.personal[2] = '\0';
    local_88.personal[3] = '\0';
    local_88.personal[4] = '\0';
    local_88.personal[5] = '\0';
    local_88.personal[6] = '\0';
    local_88.personal[7] = '\0';
    blake2s_init_param(S,&local_88);
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    memcpy(&local_68,key,keylen);
    blake2s_update(S,&local_68,0x40);
    iVar1 = 0;
    memset(&local_68,0,0x40);
  }
  return iVar1;
}

Assistant:

int blake2s_init_key( blake2s_state *S, size_t outlen, const void *key, size_t keylen )
{
  blake2s_param P[1];

  if ( ( !outlen ) || ( outlen > BLAKE2S_OUTBYTES ) ) return -1;

  if ( !key || !keylen || keylen > BLAKE2S_KEYBYTES ) return -1;

  P->digest_length = (uint8_t)outlen;
  P->key_length    = (uint8_t)keylen;
  P->fanout        = 1;
  P->depth         = 1;
  store32( &P->leaf_length, 0 );
  store32( &P->node_offset, 0 );
  store16( &P->xof_length, 0 );
  P->node_depth    = 0;
  P->inner_length  = 0;
  /* memset(P->reserved, 0, sizeof(P->reserved) ); */
  memset( P->salt,     0, sizeof( P->salt ) );
  memset( P->personal, 0, sizeof( P->personal ) );

  if( blake2s_init_param( S, P ) < 0 ) return -1;

  {
    uint8_t block[BLAKE2S_BLOCKBYTES];
    memset( block, 0, BLAKE2S_BLOCKBYTES );
    memcpy( block, key, keylen );
    blake2s_update( S, block, BLAKE2S_BLOCKBYTES );
    secure_zero_memory( block, BLAKE2S_BLOCKBYTES ); /* Burn the key from stack */
  }
  return 0;
}